

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

bool baryonyx::itm::
     affect<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
               (solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                *slv,bit_array *x,row_value *it,int k,int selected,int r_size,longdouble kappa,
               longdouble delta)

{
  longdouble lVar1;
  int iVar2;
  rc_data *prVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  longdouble *plVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  longdouble lVar11;
  longdouble lVar12;
  
  plVar7 = (slv->pi)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>.
           _M_t.super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
           super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
  lVar8 = (long)k;
  lVar1 = plVar7[lVar8];
  if (selected < 0) {
    lVar11 = ((slv->R)._M_t.
              super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
              .
              super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
             ._M_head_impl)->value * (longdouble)0.5 * (kappa / ((longdouble)1 - kappa)) + delta;
    if (r_size != 0) {
      lVar5 = 0;
      do {
        prVar3 = (slv->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
                 ._M_head_impl;
        iVar2 = *(int *)((long)&prVar3->id + lVar5);
        if (*(int *)((long)&prVar3->f + lVar5) < 0) {
          bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
          lVar6 = (long)it[iVar2].value;
          plVar7 = (slv->P)._M_t.
                   super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                   super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                   super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
          lVar12 = lVar11 + plVar7[lVar6];
        }
        else {
          bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
          lVar6 = (long)it[iVar2].value;
          plVar7 = (slv->P)._M_t.
                   super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                   super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                   super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
          lVar12 = plVar7[lVar6] - lVar11;
        }
        lVar5 = lVar5 + 0x20;
        plVar7[lVar6] = lVar12;
      } while ((ulong)(uint)r_size << 5 != lVar5);
    }
  }
  else if ((int)(selected + 1U) < r_size) {
    prVar3 = (slv->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
             ._M_head_impl;
    uVar9 = (ulong)(selected + 1U);
    uVar10 = 0;
    plVar7[lVar8] = lVar1 + (prVar3[uVar9].value + prVar3[(uint)selected].value) * (longdouble)0.5;
    lVar11 = (prVar3[uVar9].value - prVar3[(uint)selected].value) *
             (kappa / ((longdouble)1 - kappa)) + delta;
    do {
      prVar3 = (slv->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
               ._M_head_impl;
      iVar2 = *(int *)((long)&prVar3->id + uVar10);
      if (*(int *)((long)&prVar3->f + uVar10) < 0) {
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
        lVar5 = (long)it[iVar2].value;
        plVar7 = (slv->P)._M_t.
                 super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                 super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                 super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
        lVar12 = plVar7[lVar5] - lVar11;
      }
      else {
        bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
        lVar5 = (long)it[iVar2].value;
        plVar7 = (slv->P)._M_t.
                 super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                 super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                 super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
        lVar12 = lVar11 + plVar7[lVar5];
      }
      uVar10 = uVar10 + 0x20;
      plVar7[lVar5] = lVar12;
    } while (uVar9 * 0x20 != uVar10);
    uVar10 = uVar9 * 0x20 | 0x14;
    lVar5 = (uint)r_size - uVar9;
    do {
      prVar3 = (slv->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
               ._M_head_impl;
      iVar2 = *(int *)((long)&prVar3->value + uVar10);
      if (*(int *)((long)prVar3 + (uVar10 - 4)) < 0) {
        bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
        lVar6 = (long)it[iVar2].value;
        plVar7 = (slv->P)._M_t.
                 super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                 super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                 super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
        lVar12 = lVar11 + plVar7[lVar6];
      }
      else {
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
        lVar6 = (long)it[iVar2].value;
        plVar7 = (slv->P)._M_t.
                 super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                 super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                 super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
        lVar12 = plVar7[lVar6] - lVar11;
      }
      uVar10 = uVar10 + 0x20;
      lVar5 = lVar5 + -1;
      plVar7[lVar6] = lVar12;
    } while (lVar5 != 0);
  }
  else {
    lVar11 = (slv->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
             ._M_head_impl[(uint)selected].value * (longdouble)1.5 *
             (kappa / ((longdouble)1 - kappa)) + delta;
    if (r_size != 0) {
      lVar5 = 0;
      do {
        prVar3 = (slv->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
                 ._M_head_impl;
        iVar2 = *(int *)((long)&prVar3->id + lVar5);
        if (*(int *)((long)&prVar3->f + lVar5) < 0) {
          bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
          lVar6 = (long)it[iVar2].value;
          plVar7 = (slv->P)._M_t.
                   super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                   super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                   super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
          lVar12 = plVar7[lVar6] - lVar11;
        }
        else {
          bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
          lVar6 = (long)it[iVar2].value;
          plVar7 = (slv->P)._M_t.
                   super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                   super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                   super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
          lVar12 = lVar11 + plVar7[lVar6];
        }
        lVar5 = lVar5 + 0x20;
        plVar7[lVar6] = lVar12;
      } while ((ulong)(uint)r_size << 5 != lVar5);
    }
  }
  bVar4 = is_valid_constraint<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array>
                    (slv,k,x);
  if (!bVar4) {
    affect<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
              ();
  }
  return (bool)((byte)((byte)((unkuint10)lVar1 >> 0x48) ^
                      (byte)((ushort)*(undefined2 *)
                                      ((long)(slv->pi)._M_t.
                                             super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>
                                             .super__Head_base<0UL,_long_double_*,_false>.
                                             _M_head_impl + lVar8 * 0x10 + 8) >> 8)) >> 7);
}

Assistant:

bool
affect(Solver& slv,
       Xtype& x,
       Iterator it,
       int k,
       int selected,
       int r_size,
       const Float kappa,
       const Float delta)
{
    constexpr Float one{ 1 };
    constexpr Float two{ 2 };
    constexpr Float middle{ (two + one) / two };

    const auto old_pi = slv.pi[k];

    auto d = delta;

    if (selected < 0) {
        // slv.pi[k] += slv.R[0].value / two;
        d += (kappa / (one - kappa)) * (slv.R[0].value / two);

        for (int i = 0; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.set(var->column);
                slv.P[var->value] += d;
            } else {
                x.unset(var->column);
                slv.P[var->value] -= d;
            }
        }
    } else if (selected + 1 >= r_size) {
        // slv.pi[k] += slv.R[selected].value * middle;
        d += (kappa / (one - kappa)) * (slv.R[selected].value * middle);

        for (int i = 0; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.unset(var->column);
                slv.P[var->value] -= d;
            } else {
                x.set(var->column);
                slv.P[var->value] += d;
            }
        }
    } else {
        slv.pi[k] +=
          ((slv.R[selected].value + slv.R[selected + 1].value) / two);
        d += (kappa / (one - kappa)) *
             (slv.R[selected + 1].value - slv.R[selected].value);

        int i = 0;
        for (; i <= selected; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.unset(var->column);
                slv.P[var->value] -= d;
            } else {
                x.set(var->column);
                slv.P[var->value] += d;
            }
        }

        for (; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.set(var->column);
                slv.P[var->value] += d;
            } else {
                x.unset(var->column);
                slv.P[var->value] -= d;
            }
        }
    }

    // TODO job: develops is_valid_constraint for all the solvers
    bx_expects(is_valid_constraint(slv, k, x));

    return is_signbit_change(old_pi, slv.pi[k]);
}